

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

void __thiscall
google::protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::
AddAnnotationNew(AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *this,Annotation *a)

{
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>_>
  *this_00;
  string_view data;
  
  this_00 = internal::RepeatedPtrFieldBase::
            Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>>
                      ((RepeatedPtrFieldBase *)&(this->annotation_proto_->field_0)._impl_);
  data._M_str = (a->second)._M_dataplus._M_p;
  data._M_len = (a->second)._M_string_length;
  MessageLite::ParseFromString((MessageLite *)this_00,data);
  (this_00->field_0)._impl_.begin_ = (int32_t)(a->first).first;
  (this_00->field_0)._impl_.end_ = (int32_t)(a->first).second;
  (this_00->field_0)._impl_._has_bits_.has_bits_[0] =
       (this_00->field_0)._impl_._has_bits_.has_bits_[0] | 6;
  return;
}

Assistant:

void AddAnnotationNew(Annotation& a) override {
    auto* annotation = annotation_proto_->add_annotation();
    annotation->ParseFromString(a.second);
    annotation->set_begin(a.first.first);
    annotation->set_end(a.first.second);
  }